

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::TempDirectorySetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  string *this;
  BufferManager *pBVar1;
  PermissionException *this_00;
  string local_48;
  
  if ((config->options).enable_external_access != false) {
    if (input->is_null == true) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,anon_var_dwarf_643533f + 9);
    }
    else {
      Value::ToString_abi_cxx11_(&local_48,input);
    }
    this = &(config->options).temporary_directory;
    ::std::__cxx11::string::operator=((string *)this,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    (config->options).use_temporary_directory =
         (config->options).temporary_directory._M_string_length != 0;
    if (db != (DatabaseInstance *)0x0) {
      pBVar1 = BufferManager::GetBufferManager(db);
      (*pBVar1->_vptr_BufferManager[0x1c])(pBVar1,this);
    }
    return;
  }
  this_00 = (PermissionException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Modifying the temp_directory has been disabled by configuration",
             "");
  PermissionException::PermissionException(this_00,&local_48);
  __cxa_throw(this_00,&PermissionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TempDirectorySetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	if (!config.options.enable_external_access) {
		throw PermissionException("Modifying the temp_directory has been disabled by configuration");
	}
	config.options.temporary_directory = input.IsNull() ? "" : input.ToString();
	config.options.use_temporary_directory = !config.options.temporary_directory.empty();
	if (db) {
		auto &buffer_manager = BufferManager::GetBufferManager(*db);
		buffer_manager.SetTemporaryDirectory(config.options.temporary_directory);
	}
}